

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Parser::parseValue(Parser *this,Builder *output)

{
  bool bVar1;
  char cVar2;
  ArrayPtr<const_char> expected;
  Fault local_b8;
  Fault f_1;
  StringPtr local_90;
  ArrayPtr<const_char> local_80;
  StringPtr local_68;
  ArrayPtr<const_char> local_58;
  Fault local_48;
  Fault f;
  Type local_30;
  undefined1 local_28 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:632:5)>
  _kjDefer632;
  Builder *output_local;
  Parser *this_local;
  
  _kjDefer632._8_8_ = output;
  Input::consumeWhitespace(&this->input);
  local_30.this = this;
  kj::
  defer<capnp::(anonymous_namespace)::Parser::parseValue(capnp::json::Value::Builder&)::_lambda()_1_>
            ((kj *)local_28,&local_30);
  bVar1 = Input::exhausted(&this->input);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    cVar2 = Input::nextChar(&this->input);
    switch(cVar2) {
    case '\"':
      parseString(this,(Builder *)_kjDefer632._8_8_);
      break;
    default:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                (&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x286,FAILED,(char *)0x0,"\"Unexpected input in JSON message.\"",
                 (char (*) [34])"Unexpected input in JSON message.");
      kj::_::Debug::Fault::fatal(&local_b8);
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      parseNumber(this,(Builder *)_kjDefer632._8_8_);
      break;
    case '[':
      parseArray(this,(Builder *)_kjDefer632._8_8_);
      break;
    case 'f':
      kj::StringPtr::StringPtr(&local_90,"false");
      local_80 = kj::StringPtr::operator_cast_to_ArrayPtr(&local_90);
      Input::consume(&this->input,local_80);
      json::Value::Builder::setBoolean((Builder *)_kjDefer632._8_8_,false);
      break;
    case 'n':
      kj::StringPtr::StringPtr(&local_68,"null");
      local_58 = kj::StringPtr::operator_cast_to_ArrayPtr(&local_68);
      Input::consume(&this->input,local_58);
      json::Value::Builder::setNull((Builder *)_kjDefer632._8_8_);
      break;
    case 't':
      kj::StringPtr::StringPtr((StringPtr *)&f_1,"true");
      expected = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&f_1);
      Input::consume(&this->input,expected);
      json::Value::Builder::setBoolean((Builder *)_kjDefer632._8_8_,true);
      break;
    case '{':
      parseObject(this,(Builder *)_kjDefer632._8_8_);
    }
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++:632:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:632:5)>
                 *)local_28);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x27a,FAILED,"!input.exhausted()","\"JSON message ends prematurely.\"",
             (char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

void parseValue(JsonValue::Builder& output) {
    input.consumeWhitespace();
    KJ_DEFER(input.consumeWhitespace());

    KJ_REQUIRE(!input.exhausted(), "JSON message ends prematurely.");

    switch (input.nextChar()) {
      case 'n': input.consume(kj::StringPtr("null"));  output.setNull();         break;
      case 'f': input.consume(kj::StringPtr("false")); output.setBoolean(false); break;
      case 't': input.consume(kj::StringPtr("true"));  output.setBoolean(true);  break;
      case '"': parseString(output); break;
      case '[': parseArray(output);  break;
      case '{': parseObject(output); break;
      case '-': case '0': case '1': case '2': case '3':
      case '4': case '5': case '6': case '7': case '8':
      case '9': parseNumber(output); break;
      default: KJ_FAIL_REQUIRE("Unexpected input in JSON message.");
    }
  }